

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::HttpClient::WebSocketResponse,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++:5219:13)>
::getImpl(SimpleTransformPromiseNode<kj::HttpClient::WebSocketResponse,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_test_c__:5219:13)>
          *this,ExceptionOrValue *output)

{
  undefined8 uVar1;
  ExceptionOr<kj::HttpClient::WebSocketResponse> depResult;
  Own<kj::WebSocket,_std::nullptr_t> local_3e0;
  WebSocketResponse local_3d0;
  ExceptionOr<kj::Own<kj::WebSocket,_std::nullptr_t>_> local_398;
  ExceptionOr<kj::HttpClient::WebSocketResponse> local_1f0;
  
  local_1f0.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_1f0.value.ptr.isSet = false;
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,&local_1f0.super_ExceptionOrValue);
  if (local_1f0.super_ExceptionOrValue.exception.ptr.isSet == true) {
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_398,
               &local_1f0.super_ExceptionOrValue.exception.ptr.field_1.value);
    local_398.value.ptr.disposer = (Disposer *)0x0;
    local_398.value.ptr.ptr = (WebSocket *)0x0;
    ExceptionOr<kj::Own<kj::WebSocket,_std::nullptr_t>_>::operator=
              ((ExceptionOr<kj::Own<kj::WebSocket,_std::nullptr_t>_> *)output,&local_398);
    ExceptionOr<kj::Own<kj::WebSocket,_std::nullptr_t>_>::~ExceptionOr(&local_398);
  }
  else if (local_1f0.value.ptr.isSet == true) {
    HttpClient::WebSocketResponse::WebSocketResponse(&local_3d0,&local_1f0.value.ptr.field_1.value);
    uVar1 = local_3d0.webSocketOrBody.field_1._8_8_;
    local_3e0.disposer = (Disposer *)local_3d0.webSocketOrBody.field_1._0_8_;
    local_3d0.webSocketOrBody.field_1._8_8_ = (WebSocket *)0x0;
    OneOf<kj::Own<kj::AsyncInputStream,_std::nullptr_t>,_kj::Own<kj::WebSocket,_std::nullptr_t>_>::
    ~OneOf(&local_3d0.webSocketOrBody);
    local_398.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_398.value.ptr.disposer = (Disposer *)local_3d0.webSocketOrBody.field_1._0_8_;
    local_398.value.ptr.ptr = (WebSocket *)uVar1;
    local_3e0.ptr = (WebSocket *)0x0;
    ExceptionOr<kj::Own<kj::WebSocket,_std::nullptr_t>_>::operator=
              ((ExceptionOr<kj::Own<kj::WebSocket,_std::nullptr_t>_> *)output,&local_398);
    ExceptionOr<kj::Own<kj::WebSocket,_std::nullptr_t>_>::~ExceptionOr(&local_398);
    Own<kj::WebSocket,_std::nullptr_t>::dispose(&local_3e0);
  }
  ExceptionOr<kj::HttpClient::WebSocketResponse>::~ExceptionOr(&local_1f0);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }